

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

float __thiscall
pbrt::MIPMap::EWA<float>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  float fVar1;
  Point2i st_00;
  Point2i st_01;
  int iVar2;
  float *pfVar3;
  int *piVar4;
  int in_ESI;
  float fVar5;
  float level_00;
  float fVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar12 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  Float weight;
  int index;
  Float r2;
  Float ss;
  int is;
  Float tt;
  int it;
  Float sumWts;
  float sum;
  int t1;
  int t0;
  int s1;
  int s0;
  Float vSqrt;
  Float uSqrt;
  Float invDet;
  Float det;
  Float invF;
  Float C;
  Float B;
  Float A;
  Point2i levelRes;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  float fVar13;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  float fVar14;
  undefined4 in_stack_ffffffffffffff2c;
  float fVar15;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  float fVar16;
  int local_94;
  int local_90;
  int local_8c;
  float local_88;
  float local_84;
  int local_80;
  float local_7c;
  int local_78;
  float local_74;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  Tuple2<pbrt::Point2,_int> local_3c [2];
  int local_2c;
  Tuple2<pbrt::Vector2,_float> local_1c;
  Tuple2<pbrt::Vector2,_float> local_14;
  Tuple2<pbrt::Point2,_float> local_c;
  Float local_4;
  undefined1 extraout_var [60];
  
  local_c = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_14 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM1._0_16_);
  local_1c = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM2._0_16_);
  local_2c = in_ESI;
  iVar2 = Levels((MIPMap *)0x70282e);
  if (in_ESI < iVar2) {
    local_3c[0] = (Tuple2<pbrt::Point2,_int>)
                  LevelResolution((MIPMap *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  in_stack_ffffffffffffff04);
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,0);
    fVar5 = *pfVar3;
    auVar12 = (undefined1  [12])0x0;
    piVar4 = Tuple2<pbrt::Point2,_int>::operator[](local_3c,0);
    auVar9._0_4_ = (float)*piVar4;
    auVar9._4_12_ = auVar12;
    auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar5),SUB6416(ZEXT464(0xbf000000),0));
    fVar5 = auVar9._0_4_;
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,0);
    *pfVar3 = fVar5;
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,1);
    fVar5 = *pfVar3;
    auVar12 = (undefined1  [12])0x0;
    piVar4 = Tuple2<pbrt::Point2,_int>::operator[](local_3c,1);
    auVar10._0_4_ = (float)*piVar4;
    auVar10._4_12_ = auVar12;
    auVar9 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar5),SUB6416(ZEXT464(0xbf000000),0));
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,1);
    *pfVar3 = auVar9._0_4_;
    piVar4 = Tuple2<pbrt::Point2,_int>::operator[](local_3c,0);
    iVar2 = *piVar4;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,0);
    *pfVar3 = (float)iVar2 * *pfVar3;
    piVar4 = Tuple2<pbrt::Point2,_int>::operator[](local_3c,1);
    iVar2 = *piVar4;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,1);
    *pfVar3 = (float)iVar2 * *pfVar3;
    piVar4 = Tuple2<pbrt::Point2,_int>::operator[](local_3c,0);
    iVar2 = *piVar4;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    *pfVar3 = (float)iVar2 * *pfVar3;
    piVar4 = Tuple2<pbrt::Point2,_int>::operator[](local_3c,1);
    level_00 = (float)*piVar4;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    *pfVar3 = level_00 * *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,1);
    fVar5 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,1);
    fVar15 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    fVar14 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar5),
                             ZEXT416((uint)(fVar14 * *pfVar3)));
    local_40 = auVar9._0_4_ + 1.0;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,0);
    fVar6 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,1);
    fVar7 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    fVar16 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6),
                             ZEXT416((uint)(fVar16 * *pfVar3)));
    local_44 = auVar9._0_4_ * -2.0;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,0);
    fVar6 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,0);
    fVar7 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    fVar1 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6),
                             ZEXT416((uint)(fVar1 * *pfVar3)));
    local_48 = auVar9._0_4_ + 1.0;
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_48),ZEXT416((uint)local_40),
                             ZEXT416((uint)-(local_44 * local_44 * 0.25)));
    local_4c = 1.0 / auVar9._0_4_;
    local_40 = local_4c * local_40;
    local_44 = local_4c * local_44;
    local_48 = local_4c * local_48;
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)-local_44),
                             ZEXT416((uint)(local_40 * 4.0 * local_48)));
    local_50 = auVar9._0_4_;
    local_54 = 1.0 / local_50;
    local_58 = SafeSqrt(0.0);
    local_5c = SafeSqrt(0.0);
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,0);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_58),ZEXT416((uint)-(local_54 * 2.0)),
                             ZEXT416((uint)*pfVar3));
    dVar8 = std::ceil(auVar9._0_8_);
    local_60 = (int)SUB84(dVar8,0);
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,0);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_58),ZEXT416((uint)(local_54 * 2.0)),
                             ZEXT416((uint)*pfVar3));
    dVar8 = std::floor(auVar9._0_8_);
    local_64 = (int)SUB84(dVar8,0);
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_5c),ZEXT416((uint)-(local_54 * 2.0)),
                             ZEXT416((uint)*pfVar3));
    dVar8 = std::ceil(auVar9._0_8_);
    local_68 = (int)SUB84(dVar8,0);
    pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_5c),ZEXT416((uint)(local_54 * 2.0)),
                             ZEXT416((uint)*pfVar3));
    dVar8 = std::floor(auVar9._0_8_);
    local_6c = (int)SUB84(dVar8,0);
    local_70 = 0.0;
    local_74 = 0.0;
    for (local_78 = local_68; local_78 <= local_6c; local_78 = local_78 + 1) {
      fVar6 = (float)local_78;
      pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,1);
      local_7c = fVar6 - *pfVar3;
      for (local_80 = local_60; local_80 <= local_64; local_80 = local_80 + 1) {
        fVar7 = (float)local_80;
        pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](&local_c,0);
        local_84 = fVar7 - *pfVar3;
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_84),ZEXT416((uint)(local_40 * local_84)),
                                 ZEXT416((uint)(local_44 * local_84 * local_7c)));
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_7c),ZEXT416((uint)(local_48 * local_7c)),auVar9
                                );
        local_88 = auVar9._0_4_;
        if (local_88 < 1.0) {
          local_90 = (int)(local_88 * 128.0);
          local_94 = 0x7f;
          piVar4 = std::min<int>(&local_90,&local_94);
          local_8c = *piVar4;
          fVar1 = *(float *)(weightLut + (long)local_8c * 4);
          fVar13 = fVar1;
          Point2<int>::Point2((Point2<int> *)CONCAT44(fVar6,fVar7),(int)fVar1,local_2c);
          st_01.super_Tuple2<pbrt::Point2,_int>.y = (int)fVar16;
          st_01.super_Tuple2<pbrt::Point2,_int>.x = (int)fVar5;
          auVar11._0_4_ = Texel<float>((MIPMap *)CONCAT44(fVar15,fVar14),(int)level_00,st_01);
          auVar11._4_60_ = extraout_var;
          auVar9 = vfmadd213ss_fma(auVar11._0_16_,ZEXT416((uint)fVar13),ZEXT416((uint)local_70));
          local_70 = auVar9._0_4_;
          local_74 = fVar1 + local_74;
        }
      }
    }
    local_4 = local_70 / local_74;
  }
  else {
    Levels((MIPMap *)0x702842);
    Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    st_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffff34;
    st_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffff30;
    local_4 = Texel<float>((MIPMap *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff24,st_00);
  }
  return local_4;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});

    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Compute ellipse coefficients to bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and compute quadratic equation
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if inside ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * WeightLUTSize, WeightLUTSize - 1);
                Float weight = weightLut[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}